

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

void __thiscall helics::BrokerApp::BrokerApp(BrokerApp *this,CoreType ctype,string_view argString)

{
  undefined8 in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  BrokerApp *unaff_retaddr;
  undefined1 in_stack_00000008 [16];
  string_view in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  CoreType ctype_00;
  
  ctype_00 = (CoreType)((ulong)in_RCX >> 0x20);
  std::__cxx11::string::string(in_stack_ffffffffffffff90);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RDI);
  BrokerApp(unaff_retaddr,ctype_00,in_stack_00000018,(string_view)in_stack_00000008);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, std::string_view argString):
    BrokerApp(ctype, std::string{}, argString)
{
}